

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

Module __thiscall tvm::runtime::TVMRetValue::operator_cast_to_Module(TVMRetValue *this)

{
  ostream *poVar1;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  Module MVar3;
  LogCheckError _check_err;
  LogCheckError local_1b0;
  LogMessageFatal local_1a8;
  
  local_1a8.log_stream_ = (ostringstream)0x9;
  local_1a8._1_3_ = 0;
  dmlc::LogCheck_EQ<int,TVMTypeCode>
            ((dmlc *)&local_1b0,(int *)(in_RSI + 1),(anon_enum_32 *)&local_1a8);
  if (local_1b0.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x2a5);
    poVar1 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"type_code_ == kModuleHandle");
    poVar1 = std::operator<<(poVar1,(string *)local_1b0.str);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1," expected ");
    poVar1 = std::operator<<(poVar1,"ModuleHandle");
    poVar1 = std::operator<<(poVar1," but get ");
    pcVar2 = TypeCode2Str(*(int *)(in_RSI + 1));
    std::operator<<(poVar1,pcVar2);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1b0);
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)*in_RSI);
  MVar3.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar3.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar3.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

operator Module() const {
    TVM_CHECK_TYPE_CODE(type_code_, kModuleHandle);
    return *ptr<Module>();
  }